

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

int MPLSParser::calcPlayItemID(MPLSStreamInfo *streamInfo,uint32_t pts)

{
  pointer pmVar1;
  ulong uVar2;
  size_t *psVar3;
  ulong uVar4;
  
  pmVar1 = (streamInfo->super_M2TSStreamInfo).m_index.
           super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(streamInfo->super_M2TSStreamInfo).m_index.
                 super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1) / 0x30;
  psVar3 = (size_t *)((long)&(pmVar1->_M_t)._M_impl.super__Rb_tree_header + 0x20);
  uVar4 = 0;
  do {
    if (uVar2 == uVar4) {
LAB_001e9962:
      return (int)uVar2 + -1;
    }
    if ((*psVar3 != 0) && ((ulong)pts < *(ulong *)((_Base_ptr)psVar3[-2] + 1))) {
      uVar2 = 1;
      if (1 < (int)uVar4) {
        uVar2 = uVar4 & 0xffffffff;
      }
      goto LAB_001e9962;
    }
    uVar4 = uVar4 + 1;
    psVar3 = psVar3 + 6;
  } while( true );
}

Assistant:

int MPLSParser::calcPlayItemID(const MPLSStreamInfo& streamInfo, const uint32_t pts)
{
    for (size_t i = 0; i < streamInfo.m_index.size(); i++)
    {
        if (!streamInfo.m_index[i].empty())
        {
            if (streamInfo.m_index[i].begin()->first > pts)
                return FFMAX((int)i, 1) - 1;
        }
    }
    return static_cast<int>(streamInfo.m_index.size()) - 1;
}